

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_errormsg(lua_State *L)

{
  StkId pSVar1;
  long lVar2;
  undefined8 *puVar3;
  TString *pTVar4;
  TString *x_;
  TValue *io;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  StkId errfunc;
  lua_State *L_local;
  
  if (L->errfunc != 0) {
    puVar3 = (undefined8 *)((long)(L->stack).p + L->errfunc);
    pSVar1 = (L->top).p;
    lVar2 = (L->top).offset;
    (pSVar1->val).value_ = *(Value *)(lVar2 + -0x10);
    (pSVar1->val).tt_ = *(lu_byte *)(lVar2 + -8);
    lVar2 = (L->top).offset;
    *(undefined8 *)(lVar2 + -0x10) = *puVar3;
    *(undefined1 *)(lVar2 + -8) = *(undefined1 *)(puVar3 + 1);
    (L->top).p = (StkId)((L->top).offset + 0x10);
    luaD_callnoyield(L,(StkId)((L->top).offset + -0x20),1);
  }
  if ((*(byte *)((L->top).offset + -8) & 0xf) == 0) {
    lVar2 = (L->top).offset;
    pTVar4 = luaS_newlstr(L,"<no error object>",0x11);
    *(TString **)(lVar2 + -0x10) = pTVar4;
    *(byte *)(lVar2 + -8) = pTVar4->tt | 0x40;
  }
  luaD_throw(L,'\x02');
}

Assistant:

l_noret luaG_errormsg (lua_State *L) {
  if (L->errfunc != 0) {  /* is there an error handling function? */
    StkId errfunc = restorestack(L, L->errfunc);
    lua_assert(ttisfunction(s2v(errfunc)));
    setobjs2s(L, L->top.p, L->top.p - 1);  /* move argument */
    setobjs2s(L, L->top.p - 1, errfunc);  /* push function */
    L->top.p++;  /* assume EXTRA_STACK */
    luaD_callnoyield(L, L->top.p - 2, 1);  /* call it */
  }
  if (ttisnil(s2v(L->top.p - 1))) {  /* error object is nil? */
    /* change it to a proper message */
    setsvalue2s(L, L->top.p - 1, luaS_newliteral(L, "<no error object>"));
  }
  luaD_throw(L, LUA_ERRRUN);
}